

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.cpp
# Opt level: O1

void __thiscall pstore::exchange::import_ns::rule::log_top_impl(rule *this,bool is_push)

{
  long *plVar1;
  context *pcVar2;
  _Map_pointer ppuVar3;
  undefined8 *puVar4;
  not_null<const_char_*> nVar5;
  int iVar6;
  ostream *poVar7;
  _Elt_pointer puVar8;
  undefined4 extraout_var;
  size_t sVar9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar10;
  long lVar11;
  long *in_FS_OFFSET;
  ostringstream str;
  char local_1d0;
  undefined7 uStack_1cf;
  long local_1c0 [2];
  not_null<const_char_*> local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  char *__s;
  
  pstore::details::log_destinations::__tls_init();
  plVar1 = (long *)(*in_FS_OFFSET + -8);
  if (*plVar1 == 0) {
    assert_failed("logging_enabled ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_rule.cpp"
                  ,0x55);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar2 = (this->context_).ptr_;
  ppuVar3 = (pcVar2->stack).c.
            super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar11 = ((long)(pcVar2->stack).c.
                  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(pcVar2->stack).c.
                  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)(pcVar2->stack).c.
                  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(pcVar2->stack).c.
                  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)ppuVar3 -
                     (long)(pcVar2->stack).c.
                           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(ppuVar3 == (_Map_pointer)0x0)) * 0x40;
  if (lVar11 != 0) {
    do {
      std::ostream::write((char *)local_1a8,0x13d97d);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  local_1d0 = !is_push * '\x02' + '+';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d0,1);
  puVar8 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar8 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar8 = (pcVar2->stack).c.
             super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  iVar6 = (*(puVar8[-1]._M_t.
             super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
             .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl)->
            _vptr_rule[2])();
  __s = (char *)CONCAT44(extraout_var,iVar6);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar9);
  }
  std::__cxx11::stringbuf::str();
  local_1b0.ptr_ = (char *)CONCAT71(uStack_1cf,local_1d0);
  gsl::not_null<const_char_*>::ensure_invariant(&local_1b0);
  nVar5.ptr_ = local_1b0.ptr_;
  pstore::details::log_destinations::__tls_init();
  if (*plVar1 != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar4 = (undefined8 *)((undefined8 *)*plVar1)[1];
    for (puVar10 = *(undefined8 **)*plVar1; puVar10 != puVar4; puVar10 = puVar10 + 1) {
      (**(code **)(*(long *)*puVar10 + 0x48))((long *)*puVar10,5,nVar5.ptr_);
    }
  }
  if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
    operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void rule::log_top_impl (bool const is_push) const {
                PSTORE_ASSERT (logging_enabled ());
                std::ostringstream str;
                auto const & stack = context_->stack;
                str << indent{stack.size ()} << (is_push ? '+' : '-') << stack.top ()->name ();
                log (logger::priority::notice, str.str ().c_str ());
            }